

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::prepend(QByteArray *this,QByteArray *ba)

{
  long lVar1;
  Data *pDVar2;
  QByteArray *pQVar3;
  long lVar4;
  QByteArrayView data;
  
  lVar1 = (ba->d).size;
  if ((this->d).size == 0) {
    pDVar2 = (this->d).d;
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar2->super_QArrayData).alloc;
    }
    if ((lVar4 < lVar1) && ((ba->d).d != (Data *)0x0)) {
      QArrayDataPointer<char>::operator=(&this->d,&ba->d);
      return this;
    }
  }
  data.m_data = (ba->d).ptr;
  data.m_size = lVar1;
  pQVar3 = insert(this,0,data);
  return pQVar3;
}

Assistant:

QByteArray &QByteArray::prepend(const QByteArray &ba)
{
    if (size() == 0 && ba.size() > d.constAllocatedCapacity() && ba.d.isMutable())
        return (*this = ba);
    return prepend(QByteArrayView(ba));
}